

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

double __thiscall
HighsDomain::adjustedLb(HighsDomain *this,HighsInt col,HighsCDouble boundVal,bool *accept)

{
  double dVar1;
  HighsMipSolver *pHVar2;
  HighsMipSolverData *pHVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  HighsCDouble local_38;
  HighsCDouble local_28;
  
  local_38.lo = boundVal.lo;
  local_38.hi = boundVal.hi;
  pHVar2 = this->mipsolver;
  if ((pHVar2->model_->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
      ._M_impl.super__Vector_impl_data._M_start[col] == kContinuous) {
    dVar6 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    pHVar3 = (pHVar2->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    uVar5 = -(ulong)(pHVar3->epsilon < ABS(dVar6 - (local_38.hi + local_38.lo)));
    dVar7 = (double)(~uVar5 & (ulong)dVar6 | (ulong)(local_38.hi + local_38.lo) & uVar5);
    dVar1 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    bVar4 = true;
    if (dVar1 <= -INFINITY) goto LAB_002a1d4d;
    if (dVar1 < pHVar3->feastol * -1000.0 + dVar7) {
      if (INFINITY <= dVar6) {
        dVar6 = ABS(dVar7);
        if (ABS(dVar7) <= ABS(dVar1)) {
          dVar6 = ABS(dVar1);
        }
      }
      else {
        dVar6 = dVar6 - dVar1;
      }
      bVar4 = 0.3 <= (dVar7 - dVar1) / dVar6;
      goto LAB_002a1d4d;
    }
  }
  else {
    local_28 = HighsCDouble::operator-
                         (&local_38,
                          ((pHVar2->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          feastol);
    dVar7 = local_28.lo;
    dVar6 = ceil(local_28.hi);
    dVar7 = dVar7 + dVar6;
    dVar6 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    if (dVar6 < dVar7) {
      bVar4 = ABS(dVar7) *
              ((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol * 1000.0 <
              dVar7 - dVar6;
      goto LAB_002a1d4d;
    }
  }
  bVar4 = false;
LAB_002a1d4d:
  *accept = bVar4;
  return dVar7;
}

Assistant:

double HighsDomain::adjustedLb(HighsInt col, HighsCDouble boundVal,
                               bool& accept) const {
  double bound;

  if (mipsolver->variableType(col) != HighsVarType::kContinuous) {
    bound = static_cast<double>(ceil(boundVal - mipsolver->mipdata_->feastol));
    accept = bound > col_lower_[col] &&
             bound - col_lower_[col] >
                 1000.0 * mipsolver->mipdata_->feastol * std::fabs(bound);
  } else {
    if (std::fabs(col_upper_[col] - double(boundVal)) <=
        mipsolver->mipdata_->epsilon)
      bound = col_upper_[col];
    else
      bound = double(boundVal);
    if (col_lower_[col] == -kHighsInf)
      accept = true;
    else if (bound - 1000.0 * mipsolver->mipdata_->feastol > col_lower_[col]) {
      double relativeImprove = bound - col_lower_[col];
      if (col_upper_[col] != kHighsInf)
        relativeImprove /= col_upper_[col] - col_lower_[col];
      else
        relativeImprove /=
            std::max(std::fabs(col_lower_[col]), std::fabs(bound));
      accept = relativeImprove >= 0.3;
    } else
      accept = false;
  }

  return bound;
}